

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_saver_exit_example.cpp
# Opt level: O2

void foo3(int *a)

{
  int iVar1;
  ostream *poVar2;
  
  iVar1 = *a;
  *a = 3;
  poVar2 = std::operator<<((ostream *)&std::cout,"foo3 a = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*a);
  std::endl<char,std::char_traits<char>>(poVar2);
  *a = iVar1;
  return;
}

Assistant:

void foo3(int& a) {
#if defined(__cpp_deduction_guides) && __cpp_deduction_guides >= 201611L
  nstd::saver_exit state_saver{a}; // Custom state saver on exit, without macros.
#else
  nstd::saver_exit<decltype(a)> state_saver{a}; // Custom state saver on exit, without macros.
#endif
  a = 3;
  std::cout << "foo3 a = " << a << std::endl;
  // Original state will automatically restored, on scope leave.
}